

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O2

int lws_cache_heap_invalidate(lws_cache_ttl_lru *_c,char *specific_key)

{
  lws_cache_ops *plVar1;
  int iVar2;
  undefined8 extraout_RDX;
  undefined8 uVar3;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  lws_cache_ttl_lru *plVar4;
  lws_cache_ops *plVar5;
  void *user;
  size_t size;
  
  iVar2 = lws_cache_heap_get(_c,specific_key,&user,&size);
  if (iVar2 == 0) {
    plVar4 = (_c->info).parent;
    plVar1 = _c[1].info.ops;
    uVar3 = extraout_RDX;
    if (plVar4 == (lws_cache_ttl_lru *)0x0) {
      plVar4 = _c;
    }
    while (plVar5 = plVar1, plVar5 != (lws_cache_ops *)0x0) {
      plVar1 = (lws_cache_ops *)plVar5->destroy;
      if ((*(char *)((long)&plVar5->invalidate + (long)plVar5->lookup) == '!') &&
         (iVar2 = (*((plVar4->info).ops)->tag_match)
                            (plVar4,(char *)(plVar5->lookup + (long)plVar5 + 0x31),specific_key,
                             '\x01'), uVar3 = extraout_RDX_00, iVar2 == 0)) {
        _lws_cache_heap_item_destroy
                  ((lws_cache_ttl_lru_t_heap_t *)_c,
                   (lws_cache_ttl_item_heap_t *)&plVar5[-1].invalidate);
        uVar3 = extraout_RDX_01;
      }
    }
    lws_cache_heap_item_destroy
              ((lws_cache_ttl_lru_t_heap_t *)_c,(lws_cache_ttl_item_heap_t *)((long)user + -0x48),
               (int)uVar3);
  }
  return 0;
}

Assistant:

static int
lws_cache_heap_invalidate(struct lws_cache_ttl_lru *_c, const char *specific_key)
{
	lws_cache_ttl_lru_t_heap_t *cache = (lws_cache_ttl_lru_t_heap_t *)_c;
	struct lws_cache_ttl_lru *backing = _c;
	lws_cache_ttl_item_heap_t *item;
	const void *user;
	size_t size;

	if (lws_cache_heap_get(_c, specific_key, &user, &size))
		return 0;

	if (backing->info.parent)
		backing = backing->info.parent;

	item = (lws_cache_ttl_item_heap_t *)(((uint8_t *)user) - sizeof(*item));

	/*
	 * We must invalidate any cached results that would have included this
	 */

	lws_start_foreach_dll_safe(struct lws_dll2 *, d, d1,
				   cache->items_lru.head) {
		lws_cache_ttl_item_heap_t *i = lws_container_of(d,
						lws_cache_ttl_item_heap_t,
						list_lru);
		const char *iname = ((const char *)&i[1]) + i->size;

		if (*iname == META_ITEM_LEADING) {

			/*
			 * If the item about to be added would match any cached
			 * results from before it was added, we have to
			 * invalidate them.  To check this, we have to use the
			 * matching rules at the backing store level
			 */

			if (!backing->info.ops->tag_match(backing, iname + 1,
							  specific_key, 1))
				_lws_cache_heap_item_destroy(cache, i);
		}

	} lws_end_foreach_dll_safe(d, d1);

	lws_cache_heap_item_destroy(cache, item, 0);

	return 0;
}